

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::tidy(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
       *this)

{
  void_pointer pvVar1;
  void_pointer pvVar2;
  
  clear(this);
  pvVar1 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  pvVar2 = pvVar1;
  for (; pvVar1 != (void_pointer)
                   (((ulong)((long)this->_begin_storage - (long)pvVar2) / 0x28) * 0x28 +
                   (long)pvVar2); pvVar1 = (void_pointer)((long)pvVar1 + 0x28)) {
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    *(undefined8 *)((long)pvVar1 + 8) = 0;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    pvVar2 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  }
  this->_free_elem = (elem_ptr_pointer)0x0;
  this->_begin_storage = (void_pointer)0x0;
  vector_impl::allocator_base<std::allocator<unsigned_char>_>::tidy
            (&this->super_allocator_base<std::allocator<unsigned_char>_>);
  return;
}

Assistant:

inline void vector<I, A, C>::tidy() noexcept
{
    clear();
    for (auto i = begin_elem(); i != begin_elem() + capacity(); ++i) {
        base().destroy(i);
    }
    _begin_storage = _free_elem = nullptr;
    my_base::tidy();
}